

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O2

string * __thiscall
ZXing::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ZXing *this,BitMatrix *matrix,bool inverted)

{
  bool bVar1;
  int x;
  int x_00;
  int y;
  uint y_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (y_00 = 0; (int)y_00 < *(int *)(this + 4); y_00 = y_00 + 2) {
    for (x_00 = 0; x_00 < *(int *)this; x_00 = x_00 + 1) {
      bVar1 = BitMatrix::get((BitMatrix *)this,x_00,y_00);
      if ((((bVar1 ^ (byte)matrix) & *(int *)(this + 4) == 1) == 0) &&
         ((int)(y_00 | 1) < *(int *)(this + 4))) {
        BitMatrix::get((BitMatrix *)this,x_00,y_00 | 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const BitMatrix& matrix, bool inverted)
{
	constexpr auto map = std::array{" ", "▀", "▄", "█"};
	std::string res;

	for (int y = 0; y < matrix.height(); y += 2) {
		for (int x = 0; x < matrix.width(); ++x) {
			int tp = matrix.get(x, y) ^ inverted;
			int bt = (matrix.height() == 1 && tp) || (y + 1 < matrix.height() && (matrix.get(x, y + 1) ^ inverted));
			res += map[tp | (bt << 1)];
		}
		res.push_back('\n');
	}

	return res;
}